

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkRenderPassInputAttachmentAspectCreateInfo *create_info,
          ScratchAllocator *alloc)

{
  void *__src;
  size_t size;
  undefined8 uVar1;
  VkInputAttachmentAspectReference *pVVar2;
  undefined8 *puVar3;
  void *pvVar4;
  
  puVar3 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar3 != (undefined8 *)0x0) {
    uVar1 = *(undefined8 *)create_info;
    pvVar4 = create_info->pNext;
    pVVar2 = create_info->pAspectReferences;
    puVar3[2] = *(undefined8 *)&create_info->aspectReferenceCount;
    puVar3[3] = pVVar2;
    *puVar3 = uVar1;
    puVar3[1] = pvVar4;
  }
  if ((ulong)*(uint *)(puVar3 + 2) == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    __src = (void *)puVar3[3];
    size = (ulong)*(uint *)(puVar3 + 2) * 0xc;
    pvVar4 = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (pvVar4 != (void *)0x0) {
      memmove(pvVar4,__src,size);
    }
  }
  puVar3[3] = pvVar4;
  return puVar3;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkRenderPassInputAttachmentAspectCreateInfo *create_info,
                                             ScratchAllocator &alloc)
{
	auto *input_att = copy(create_info, 1, alloc);
	input_att->pAspectReferences = copy(input_att->pAspectReferences, input_att->aspectReferenceCount, alloc);
	return input_att;
}